

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UResourceBundle *
ures_getByKeyWithFallback_63
          (UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  ResourceData *pResData;
  bool bVar1;
  uint table;
  Resource RVar2;
  int iVar3;
  size_t sVar4;
  UResourceBundle *pUVar5;
  char *pcVar6;
  UErrorCode UVar7;
  char *pcVar8;
  UResourceDataEntry *realData;
  Resource r;
  UResourceBundle *resB_00;
  int32_t local_cc;
  char *myPath;
  UErrorCode errorCode;
  UResourceBundle *local_b8;
  char *local_b0;
  UResourceBundle *local_a8;
  char *local_a0;
  char *key;
  int32_t local_90;
  int32_t t;
  CharString path;
  StringPiece local_40;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      table = resB->fRes;
      local_b0 = inKey;
      if ((table & 0xf0000000) == 0x20000000 || (table & 0xe0000000) == 0x40000000) {
        local_b8 = fillIn;
        local_a8 = resB;
        icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&path.buffer);
        path.len = 0;
        *path.buffer.ptr = '\0';
        errorCode = U_ZERO_ERROR;
        icu_63::StringPiece::StringPiece((StringPiece *)&key,local_b0);
        icu_63::CharString::append(&path,key,local_90,&errorCode);
        pUVar5 = local_a8;
        pResData = &local_a8->fResData;
        pcVar8 = path.buffer.ptr;
        if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          while ((table != 0xffffffff && (*pcVar8 != '\0'))) {
            if (((table & 0xf0000000) != 0x20000000) && ((table & 0xe0000000) != 0x40000000))
            goto LAB_002df1b0;
            pcVar6 = strchr(pcVar8,0x2f);
            if (pcVar6 == (char *)0x0) {
              sVar4 = strlen(pcVar8);
              pcVar6 = pcVar8 + sVar4;
            }
            else {
              *pcVar6 = '\0';
              pcVar6 = pcVar6 + 1;
            }
            myPath = pcVar8;
            table = res_getTableItemByKey_63(pResData,table,&t,&myPath);
            pcVar8 = pcVar6;
          }
          RVar2 = -(uint)(*pcVar8 != '\0') | table;
        }
        else {
LAB_002df1b0:
          RVar2 = 0xffffffff;
        }
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
        key = local_b0;
        realData = pUVar5->fData;
        if (RVar2 == 0xffffffff) {
          icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&path.buffer);
          path.len = 0;
          *path.buffer.ptr = '\0';
          myPath = (char *)0x0;
          local_a0 = pUVar5->fResPath;
          local_cc = pUVar5->fResPathLen;
          RVar2 = 0xffffffff;
LAB_002df2dc:
          pUVar5 = (UResourceBundle *)0x0;
          do {
            do {
              pcVar8 = local_b0;
              if (RVar2 != 0xffffffff) {
                pcVar8 = realData->fName;
                pcVar6 = uloc_getDefault_63();
                resB_00 = local_b8;
                iVar3 = strcmp(pcVar8,pcVar6);
                if (iVar3 == 0) {
                  UVar7 = U_USING_DEFAULT_WARNING;
                }
                else {
                  iVar3 = strcmp(realData->fName,"root");
                  UVar7 = (uint)(iVar3 == 0) | U_ERROR_WARNING_START;
                }
                *status = UVar7;
                fillIn = init_resb_result(&realData->fData,RVar2,local_b0,-1,realData,local_a8,0,
                                          resB_00,status);
                bVar1 = true;
                goto LAB_002df4a8;
              }
              realData = realData->fParent;
              if (realData == (UResourceDataEntry *)0x0) {
                *status = U_MISSING_RESOURCE_ERROR;
                bVar1 = true;
                fillIn = local_b8;
                resB_00 = local_b8;
                goto LAB_002df4a8;
              }
              RVar2 = 0xffffffff;
            } while (realData->fBogus != U_ZERO_ERROR);
            r = (realData->fData).rootRes;
            path.len = 0;
            *path.buffer.ptr = '\0';
            if (0 < local_cc) {
              icu_63::CharString::append(&path,local_a0,local_cc,status);
            }
            icu_63::StringPiece::StringPiece(&local_40,pcVar8);
            icu_63::CharString::append(&path,local_40.ptr_,local_40.length_,status);
            if (U_ZERO_ERROR < *status) {
              ures_close_63(pUVar5);
              bVar1 = false;
              fillIn = local_b8;
              resB_00 = local_b8;
LAB_002df4a8:
              icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
              if (!bVar1) {
                return resB_00;
              }
              goto LAB_002df4b7;
            }
            myPath = path.buffer.ptr;
            key = pcVar8;
            do {
              RVar2 = res_findResource_63(&realData->fData,r,&myPath,&key);
              if ((RVar2 & 0xf0000000) == 0x30000000) {
                if (*myPath == '\0') break;
                pUVar5 = init_resb_result(&realData->fData,RVar2,(char *)0x0,-1,realData,local_a8,0,
                                          pUVar5,status);
                if (pUVar5 == (UResourceBundle *)0x0) goto LAB_002df2dc;
                realData = pUVar5->fData;
                local_a0 = pUVar5->fResPath;
                r = pUVar5->fRes;
                local_cc = pUVar5->fResPathLen;
              }
            } while (*myPath != '\0');
          } while( true );
        }
        fillIn = init_resb_result(pResData,RVar2,local_b0,-1,realData,pUVar5,0,local_b8,status);
        pUVar5 = (UResourceBundle *)0x0;
      }
      else {
        *status = U_RESOURCE_TYPE_MISMATCH;
        pUVar5 = (UResourceBundle *)0x0;
      }
LAB_002df4b7:
      ures_close_63(pUVar5);
    }
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 
ures_getByKeyWithFallback(const UResourceBundle *resB, 
                          const char* inKey, 
                          UResourceBundle *fillIn, 
                          UErrorCode *status) {
    Resource res = RES_BOGUS, rootRes = RES_BOGUS;
    /*UResourceDataEntry *realData = NULL;*/
    UResourceBundle *helper = NULL;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        res = getTableItemByKeyPath(&(resB->fResData), resB->fRes, inKey);
        const char* key = inKey;
        if(res == RES_BOGUS) {
            UResourceDataEntry *dataEntry = resB->fData;
            CharString path;
            char *myPath = NULL;
            const char* resPath = resB->fResPath;
            int32_t len = resB->fResPathLen;
            while(res == RES_BOGUS && dataEntry->fParent != NULL) { /* Otherwise, we'll look in parents */
                dataEntry = dataEntry->fParent;
                rootRes = dataEntry->fData.rootRes;

                if(dataEntry->fBogus == U_ZERO_ERROR) {
                    path.clear();
                    if (len > 0) {
                        path.append(resPath, len, *status);
                    }
                    path.append(inKey, *status);
                    if (U_FAILURE(*status)) {
                        ures_close(helper);
                        return fillIn;
                    }
                    myPath = path.data();
                    key = inKey;
                    do {
                        res = res_findResource(&(dataEntry->fData), rootRes, &myPath, &key);
                        if (RES_GET_TYPE(res) == URES_ALIAS && *myPath) {
                            /* We hit an alias, but we didn't finish following the path. */
                            helper = init_resb_result(&(dataEntry->fData), res, NULL, -1, dataEntry, resB, 0, helper, status); 
                            /*helper = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, helper, status);*/
                            if(helper) {
                              dataEntry = helper->fData;
                              rootRes = helper->fRes;
                              resPath = helper->fResPath;
                              len = helper->fResPathLen;

                            } else {
                              break;
                            }
                        }
                    } while(*myPath); /* Continue until the whole path is consumed */
                }
            }
            /*const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);*/
            if(res != RES_BOGUS) {
              /* check if resB->fResPath gives the right name here */
                if(uprv_strcmp(dataEntry->fName, uloc_getDefault())==0 || uprv_strcmp(dataEntry->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }

                fillIn = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, fillIn, status);
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            fillIn = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }
    ures_close(helper);
    return fillIn;
}